

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O3

void __thiscall PosixSerialPort::~PosixSerialPort(PosixSerialPort *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_SerialPort)._vptr_SerialPort = (_func_int **)&PTR__PosixSerialPort_00118c88;
  if (-1 < this->_devfd) {
    ::close(this->_devfd);
  }
  (this->super_SerialPort)._vptr_SerialPort = (_func_int **)&PTR__SerialPort_00118d30;
  pcVar1 = (this->super_SerialPort)._name._M_dataplus._M_p;
  paVar2 = &(this->super_SerialPort)._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

PosixSerialPort::~PosixSerialPort()
{
    if (_devfd >= 0)
        ::close(_devfd);
}